

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O3

char ** str_split(char *str,char *delim,int *elts)

{
  char *pcVar1;
  size_t sVar2;
  char **__s;
  int iVar3;
  char *pcVar4;
  char **ppcVar5;
  size_t num;
  char *tmp;
  char **local_40;
  int *local_38;
  
  if (delim == (char *)0x0 || str == (char *)0x0) {
    __s = (char **)0x0;
  }
  else {
    iVar3 = 1;
    pcVar4 = str;
    local_38 = elts;
    do {
      pcVar1 = strpbrk(pcVar4,delim);
      if (pcVar1 == (char *)0x0) break;
      pcVar4 = pcVar1 + 1;
      iVar3 = iVar3 + 1;
    } while (pcVar1[1] != '\0');
    sVar2 = strlen(str);
    num = sVar2 + (long)iVar3 * 8 + 9;
    __s = (char **)zt_malloc_p(num);
    memset(__s,0,num);
    local_40 = __s + (long)iVar3 + 1;
    sVar2 = strlen(str);
    strncpy((char *)(__s + (long)iVar3 + 1),str,sVar2);
    *local_38 = iVar3;
    pcVar4 = strsep((char **)&local_40,delim);
    *__s = pcVar4;
    if (pcVar4 != (char *)0x0) {
      ppcVar5 = __s;
      do {
        if (*pcVar4 != '\0') {
          if (iVar3 < 2) {
            return __s;
          }
          ppcVar5 = ppcVar5 + 1;
          iVar3 = iVar3 + -1;
        }
        pcVar4 = strsep((char **)&local_40,delim);
        *ppcVar5 = pcVar4;
      } while (pcVar4 != (char *)0x0);
    }
  }
  return __s;
}

Assistant:

char **str_split(char *str, char * delim, int *elts)
{
    char * p1;
    char **ap;
    char **argv;
    int    argc;
    char * tmp;
    size_t memsize;

    if (str == NULL || delim == NULL) {
        return NULL;
    }

    argc = 1;
    p1 = str;
    while ((p1 = strpbrk(p1, delim)) != NULL) {
        ++p1;
        argc += 1;
        if (*p1 == '\0') {
            break;
        }
    }

    /* calculate the size of the char *vector then add the string to
     * the end of that (includeing null space for the empty vector
     * spot and the NUL char
     */
    memsize = (sizeof(char *) * (argc + 1)) + (sizeof(char) * (strlen(str) + 1));

    argv = (char **)zt_malloc(char, memsize);
    memset(argv, '\0', memsize);

    tmp = (char *)argv + (sizeof(char *) * (argc + 1));
    strncpy(tmp, str, strlen(str));

    *elts = argc;

    for (ap = argv; (*ap = strsep(&tmp, delim)) != NULL; ) {
        if (**ap != '\0') {
            ++ap;
            if (--argc <= 0) {
                break;
            }
        }
    }

    return argv;
}